

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O1

HaF32 * __thiscall
HACD::MyWuQuantizer::kmeansQuantize3D
          (MyWuQuantizer *this,HaU32 vcount,HaF32 *vertices,bool denormalizeResults,
          HaU32 maxVertices,HaU32 *outputCount)

{
  Vec3Vector *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  HaU32 HVar7;
  uint uVar8;
  Vec3d<float> *clusters;
  HaU32 *outputIndices;
  Vec3 *pVVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  Vec3d<float> *_output;
  
  pVVar9 = (Vec3 *)0x0;
  *outputCount = 0;
  (this->mNormalizedInput).mSize = 0;
  (this->mQuantizedOutput).mSize = 0;
  if (vcount != 0) {
    normalizeInput(this,vcount,vertices);
    clusters = (Vec3d<float> *)malloc((ulong)vcount * 0xc);
    outputIndices = (HaU32 *)malloc((ulong)vcount * 4);
    if ((this->mNormalizedInput).mSize == 0) {
LAB_0086f142:
      __assert_fail("i < mSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                    ,0x93,"T &hacd::vector<HACD::Vec3>::operator[](HaU32) [T = HACD::Vec3]");
    }
    HVar7 = kmeans_cluster<HACD::Vec3d<float>,float>
                      ((Vec3d<float> *)(this->mNormalizedInput).mData,vcount,maxVertices,clusters,
                       outputIndices,0.01,0.0001);
    *outputCount = HVar7;
    if (HVar7 == 0) {
      pVVar9 = (Vec3 *)0x0;
    }
    else {
      this_00 = &this->mQuantizedOutput;
      if (denormalizeResults) {
        if (*outputCount != 0) {
          uVar12 = 0;
          uVar10 = 0;
          do {
            auVar4 = vfmadd213ss_fma(ZEXT416((uint)(this->mScale).x),
                                     ZEXT416((uint)(&clusters->x)[uVar12]),
                                     ZEXT416((uint)(this->mCenter).x));
            auVar5 = vfmadd213ss_fma(ZEXT416((uint)(this->mScale).y),auVar4,
                                     ZEXT416((uint)(this->mCenter).y));
            auVar6 = vfmadd213ss_fma(ZEXT416((uint)(this->mScale).z),auVar4,
                                     ZEXT416((uint)(this->mCenter).z));
            uVar11 = (this->mQuantizedOutput).mCapacity;
            uVar8 = uVar11 & 0x7fffffff;
            if (uVar8 <= (this->mQuantizedOutput).mSize) {
              uVar11 = uVar11 * 2;
              if (uVar8 == 0) {
                uVar11 = 1;
              }
              if (uVar11 <= uVar8) {
LAB_0086f123:
                __assert_fail("this->capacity() < capacity",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                              ,0x208,"void hacd::vector<HACD::Vec3>::grow(HaU32) [T = HACD::Vec3]");
              }
              hacd::vector<HACD::Vec3>::recreate(this_00,uVar11);
            }
            pVVar9 = (this->mQuantizedOutput).mData;
            uVar11 = (this->mQuantizedOutput).mSize;
            pVVar9[uVar11].x = auVar4._0_4_;
            pVVar9[uVar11].y = auVar5._0_4_;
            pVVar9[uVar11].z = auVar6._0_4_;
            (this->mQuantizedOutput).mSize = uVar11 + 1;
            uVar10 = uVar10 + 1;
            uVar12 = uVar12 + 3;
          } while (uVar10 < *outputCount);
        }
      }
      else if (*outputCount != 0) {
        uVar12 = 0;
        uVar10 = 0;
        do {
          fVar1 = (&clusters->x)[uVar12];
          fVar2 = (&clusters->y)[uVar12];
          fVar3 = (&clusters->z)[uVar12];
          uVar11 = (this->mQuantizedOutput).mCapacity;
          uVar8 = uVar11 & 0x7fffffff;
          if (uVar8 <= (this->mQuantizedOutput).mSize) {
            uVar11 = uVar11 * 2;
            if (uVar8 == 0) {
              uVar11 = 1;
            }
            if (uVar11 <= uVar8) goto LAB_0086f123;
            hacd::vector<HACD::Vec3>::recreate(this_00,uVar11);
          }
          pVVar9 = (this->mQuantizedOutput).mData;
          uVar11 = (this->mQuantizedOutput).mSize;
          pVVar9[uVar11].x = (HaF32)fVar1;
          pVVar9[uVar11].y = (HaF32)fVar2;
          pVVar9[uVar11].z = (HaF32)fVar3;
          (this->mQuantizedOutput).mSize = uVar11 + 1;
          uVar10 = uVar10 + 1;
          uVar12 = uVar12 + 3;
        } while (uVar10 < *outputCount);
      }
      if ((this->mQuantizedOutput).mSize == 0) goto LAB_0086f142;
      pVVar9 = this_00->mData;
    }
    free(clusters);
    free(outputIndices);
  }
  return &pVVar9->x;
}

Assistant:

virtual const hacd::HaF32 * kmeansQuantize3D(hacd::HaU32 vcount,
		const hacd::HaF32 *vertices,
		bool denormalizeResults,
		hacd::HaU32 maxVertices,
		hacd::HaU32 &outputCount)
	{
		const hacd::HaF32 *ret = NULL;
		outputCount = 0;
		mNormalizedInput.clear();
		mQuantizedOutput.clear();

		if ( vcount > 0 )
		{
			normalizeInput(vcount,vertices);
			HaF32 *quantizedOutput = (HaF32 *)HACD_ALLOC( sizeof(HaF32)*3*vcount);
			HaU32 *quantizedIndices = (HaU32 *)HACD_ALLOC( sizeof(HaU32)*vcount );
			outputCount = kmeans_cluster3d(&mNormalizedInput[0].x, vcount, maxVertices, quantizedOutput, quantizedIndices, 0.01f, 0.0001f );
			if ( outputCount > 0 )
			{
				if ( denormalizeResults )
				{
					for (HaU32 i=0; i<outputCount; i++)
					{
						Vec3 v( &quantizedOutput[i*3] );
						v.x = v.x*mScale.x + mCenter.x;
						v.y = v.x*mScale.y + mCenter.y;
						v.z = v.x*mScale.z + mCenter.z;
						mQuantizedOutput.push_back(v);
					}
				}
				else
				{
					for (HaU32 i=0; i<outputCount; i++)
					{
						Vec3 v( &quantizedOutput[i*3] );
						mQuantizedOutput.push_back(v);
					}
				}
				ret = &mQuantizedOutput[0].x;
			}
			HACD_FREE(quantizedOutput);
			HACD_FREE(quantizedIndices);
		}

		return ret;
	}